

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O0

void ut::
     are_equal<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,1ul,std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>>>
               (render_log_entry (*expected) [1],
               vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
               *actual,LocationInfo *location)

{
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  *pvVar1;
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  *__first1;
  bool value;
  const_iterator cVar2;
  const_iterator __last;
  unsigned_long local_30 [2];
  LocationInfo *local_20;
  LocationInfo *location_local;
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  *actual_local;
  render_log_entry (*expected_local) [1];
  
  local_30[1] = 1;
  local_20 = location;
  location_local = (LocationInfo *)actual;
  actual_local = (vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
                  *)expected;
  cVar2 = std::
          vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
          ::begin(actual);
  __last = std::
           vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
           ::end((vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
                  *)location_local);
  local_30[0] = std::
                distance<__gnu_cxx::__normal_iterator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry_const*,std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>>>>
                          ((__normal_iterator<const_agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry_*,_std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>_>
                            )cVar2._M_current,
                           (__normal_iterator<const_agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry_*,_std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>_>
                            )__last._M_current);
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,local_20);
  __first1 = actual_local;
  pvVar1 = actual_local + 1;
  cVar2 = std::
          vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
          ::begin((vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
                   *)location_local);
  value = std::
          equal<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry*,__gnu_cxx::__normal_iterator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry_const*,std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>>>>
                    ((render_log_entry *)__first1,
                     (render_log_entry *)
                     &(pvVar1->
                      super__Vector_base<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
                      )._M_impl.super__Vector_impl_data._M_finish,
                     (__normal_iterator<const_agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry_*,_std::vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>_>
                      )cVar2._M_current);
  is_true(value,local_20);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}